

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O1

void __thiscall
ConfidentialTxOut_Constractor4_Test::TestBody(ConfidentialTxOut_Constractor4_Test *this)

{
  undefined1 lhs [8];
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *pcVar3;
  ulong uVar4;
  size_t sVar5;
  Amount AVar6;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  ConfidentialTxOut txout;
  undefined1 local_1b8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined1 local_190 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [2];
  undefined1 local_158 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  ulong local_138;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  int64_t local_128;
  Amount local_120;
  ConfidentialTxOut local_110;
  
  AVar6 = cfd::core::Amount::CreateBySatoshiAmount(100000000);
  local_120.amount_ = AVar6.amount_;
  local_120.ignore_check_ = AVar6.ignore_check_;
  cfd::core::ConfidentialTxOut::ConfidentialTxOut(&local_110,&exp_asset,&local_120);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_190,&local_110.asset_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)local_1b8,(ConfidentialAssetId *)local_190);
  lhs = local_1b8;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_158,&exp_asset);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_138,"txout.GetAsset().GetHex().c_str()","exp_asset.GetHex().c_str()"
             ,(char *)lhs,(char *)local_158);
  if (local_158 != (undefined1  [8])&local_148) {
    operator_delete((void *)local_158,local_148._M_allocated_capacity + 1);
  }
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
  }
  local_190._0_8_ = &PTR__ConfidentialAssetId_007f6a80;
  if ((pointer)local_190._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_190._8_8_,local_180[0]._8_8_ - local_190._8_8_);
  }
  if (local_138._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_190);
    if (local_130.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_130.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x9b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1b8,(Message *)local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_190._0_8_ + 8))();
      }
      local_190._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)local_190,&local_110.confidential_value_);
  AVar6 = cfd::core::ConfidentialValue::GetAmount((ConfidentialValue *)local_190);
  local_158 = (undefined1  [8])AVar6.amount_;
  local_150.ptr_._0_1_ = AVar6.ignore_check_;
  local_138 = cfd::core::Amount::GetSatoshiValue((Amount *)local_158);
  local_128 = cfd::core::Amount::GetSatoshiValue(&local_120);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_1b8,"txout.GetConfidentialValue().GetAmount().GetSatoshiValue()",
             "amount.GetSatoshiValue()",(long *)&local_138,&local_128);
  local_190._0_8_ = &PTR__ConfidentialValue_007f6a50;
  if ((pointer)local_190._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_190._8_8_,local_180[0]._8_8_ - local_190._8_8_);
  }
  if (local_1b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_190);
    if (sStack_1b0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((sStack_1b0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x9d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_158,(Message *)local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_158);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_190._0_8_ + 8))();
      }
      local_190._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_1b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxOut::GetLockingScript((Script *)local_190,&local_110.super_AbstractTxOut);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_1b8,(Script *)local_190);
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_158,"txout.GetLockingScript().GetHex().c_str()","\"\"",
             (char *)local_1b8,"");
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
  }
  cfd::core::Script::~Script((Script *)local_190);
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_190);
    if ((undefined8 *)CONCAT71(local_150.ptr_._1_7_,local_150.ptr_._0_1_) != (undefined8 *)0x0) {
      pcVar3 = *(char **)CONCAT71(local_150.ptr_._1_7_,local_150.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x9e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1b8,(Message *)local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_190._0_8_ + 8))();
      }
      local_190._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_190,&local_110.nonce_);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_
            ((string *)local_1b8,(ConfidentialNonce *)local_190);
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_158,"txout.GetNonce().GetHex().c_str()","\"\"",(char *)local_1b8,"");
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
  }
  local_190._0_8_ = &PTR__ConfidentialNonce_007f6a20;
  if ((pointer)local_190._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_190._8_8_,local_180[0]._8_8_ - local_190._8_8_);
  }
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_190);
    if ((undefined8 *)CONCAT71(local_150.ptr_._1_7_,local_150.ptr_._0_1_) != (undefined8 *)0x0) {
      pcVar3 = *(char **)CONCAT71(local_150.ptr_._1_7_,local_150.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x9f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1b8,(Message *)local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_190._0_8_ + 8))();
      }
      local_190._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1b8 = (undefined1  [8])0x0;
  sStack_1b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1a8._M_allocated_capacity = 0;
  uVar4 = (long)local_110.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_110.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             operator_new(uVar4);
  }
  local_1a8._M_allocated_capacity = uVar4 + (long)pbVar2;
  sVar5 = (long)local_110.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_110.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_1b8 = (undefined1  [8])pbVar2;
  if (sVar5 != 0) {
    sStack_1b0.ptr_ = pbVar2;
    memmove(pbVar2,local_110.range_proof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar5);
  }
  sStack_1b0.ptr_ = pbVar2 + sVar5;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_190,(ByteData *)local_1b8);
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_158,"txout.GetRangeProof().GetHex().c_str()","\"\"",
             (char *)local_190._0_8_,"");
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_190 + 0x10))
  {
    operator_delete((void *)local_190._0_8_,(ulong)(local_180[0]._M_allocated_capacity + 1));
  }
  if (local_1b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity - (long)local_1b8);
  }
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_190);
    if ((undefined8 *)CONCAT71(local_150.ptr_._1_7_,local_150.ptr_._0_1_) != (undefined8 *)0x0) {
      pcVar3 = *(char **)CONCAT71(local_150.ptr_._1_7_,local_150.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xa0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1b8,(Message *)local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_190._0_8_ + 8))();
      }
      local_190._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1b8 = (undefined1  [8])0x0;
  sStack_1b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1a8._M_allocated_capacity = 0;
  uVar4 = (long)local_110.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_110.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             operator_new(uVar4);
  }
  local_1a8._M_allocated_capacity = uVar4 + (long)pbVar2;
  sVar5 = (long)local_110.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_110.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_1b8 = (undefined1  [8])pbVar2;
  if (sVar5 != 0) {
    sStack_1b0.ptr_ = pbVar2;
    memmove(pbVar2,local_110.surjection_proof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar5);
  }
  sStack_1b0.ptr_ = pbVar2 + sVar5;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_190,(ByteData *)local_1b8);
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_158,"txout.GetSurjectionProof().GetHex().c_str()","\"\"",
             (char *)local_190._0_8_,"");
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_190 + 0x10))
  {
    operator_delete((void *)local_190._0_8_,(ulong)(local_180[0]._M_allocated_capacity + 1));
  }
  if (local_1b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity - (long)local_1b8);
  }
  if (local_158[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_190);
    if ((undefined8 *)CONCAT71(local_150.ptr_._1_7_,local_150.ptr_._0_1_) != (undefined8 *)0x0) {
      pcVar3 = *(char **)CONCAT71(local_150.ptr_._1_7_,local_150.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xa1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1b8,(Message *)local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_190._0_8_ + 8))();
      }
      local_190._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_150,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  AVar6 = cfd::core::AbstractTxOut::GetValue(&local_110.super_AbstractTxOut);
  local_1b8 = (undefined1  [8])AVar6.amount_;
  sStack_1b0.ptr_._0_1_ = AVar6.ignore_check_;
  local_158 = (undefined1  [8])cfd::core::Amount::GetSatoshiValue((Amount *)local_1b8);
  local_138 = local_138 & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_190,"txout.GetValue().GetSatoshiValue()","0",(long *)local_158,
             (int *)&local_138);
  if (local_190[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1b8);
    if ((pointer)local_190._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_190._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xa2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_158,(Message *)local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_158);
    if (local_1b8 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_1b8 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_1b8 + 8))();
      }
      local_1b8 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_190 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&local_110);
  return;
}

Assistant:

TEST(ConfidentialTxOut, Constractor4) {
  // ConfidentialAssetId, ConfidentialValue
  Amount amount(Amount::CreateBySatoshiAmount(100000000));
  ConfidentialTxOut txout(exp_asset, amount);
  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), exp_asset.GetHex().c_str());
  EXPECT_EQ(txout.GetConfidentialValue().GetAmount().GetSatoshiValue(),
               amount.GetSatoshiValue());
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 0);
}